

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xpath.c
# Opt level: O0

void xmlXPathBooleanFunction(xmlXPathParserContextPtr ctxt,int nargs)

{
  int val;
  xmlXPathObjectPtr pxStack_20;
  int boolval;
  xmlXPathObjectPtr cur;
  int nargs_local;
  xmlXPathParserContextPtr ctxt_local;
  
  if (ctxt != (xmlXPathParserContextPtr)0x0) {
    if (nargs == 1) {
      if (ctxt->valueNr < 1) {
        xmlXPathErr(ctxt,0x17);
      }
      else {
        pxStack_20 = xmlXPathValuePop(ctxt);
        if (pxStack_20 == (xmlXPathObjectPtr)0x0) {
          xmlXPathErr(ctxt,10);
        }
        else {
          if (pxStack_20->type != XPATH_BOOLEAN) {
            val = xmlXPathCastToBoolean(pxStack_20);
            xmlXPathReleaseObject(ctxt->context,pxStack_20);
            pxStack_20 = xmlXPathCacheNewBoolean(ctxt,val);
          }
          xmlXPathValuePush(ctxt,pxStack_20);
        }
      }
    }
    else {
      xmlXPathErr(ctxt,0xc);
    }
  }
  return;
}

Assistant:

void
xmlXPathBooleanFunction(xmlXPathParserContextPtr ctxt, int nargs) {
    xmlXPathObjectPtr cur;

    CHECK_ARITY(1);
    cur = xmlXPathValuePop(ctxt);
    if (cur == NULL) XP_ERROR(XPATH_INVALID_OPERAND);
    if (cur->type != XPATH_BOOLEAN) {
        int boolval = xmlXPathCastToBoolean(cur);

        xmlXPathReleaseObject(ctxt->context, cur);
        cur = xmlXPathCacheNewBoolean(ctxt, boolval);
    }
    xmlXPathValuePush(ctxt, cur);
}